

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_ct.cpp
# Opt level: O0

int32_t findNextEsc(char *source,char *sourceLimit)

{
  int iVar1;
  int local_28;
  int32_t i;
  int32_t length;
  char *sourceLimit_local;
  char *source_local;
  
  iVar1 = (int)sourceLimit - (int)source;
  local_28 = 1;
  while( true ) {
    if (iVar1 <= local_28) {
      return iVar1;
    }
    if (source[local_28] == '\x1b') break;
    local_28 = local_28 + 1;
  }
  return local_28;
}

Assistant:

static int32_t findNextEsc(const char *source, const char *sourceLimit) {
    int32_t length = static_cast<int32_t>(sourceLimit - source);
    int32_t i;
    for (i = 1; i < length; i++) {
        if (*(source + i) == 0x1B) {
            return i;
        }
    }

    return length;
}